

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O3

shared_ptr<duckdb::Relation,_true> __thiscall
duckdb::Relation::InsertRel(Relation *this,string *schema_name,string *table_name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb::Relation,_true> sVar3;
  undefined1 local_59;
  shared_ptr<duckdb::InsertRelation,_true> local_58;
  enable_shared_from_this<duckdb::Relation> local_40;
  shared_ptr<duckdb::InsertRelation> local_30;
  
  enable_shared_from_this<duckdb::Relation>::shared_from_this(&local_40);
  local_30.super___shared_ptr<duckdb::InsertRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::InsertRelation,std::allocator<duckdb::InsertRelation>,duckdb::shared_ptr<duckdb::Relation,true>,std::__cxx11::string_const&,std::__cxx11::string_const&>
            (&local_30.super___shared_ptr<duckdb::InsertRelation,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(InsertRelation **)&local_30,
             (allocator<duckdb::InsertRelation> *)&local_59,
             (shared_ptr<duckdb::Relation,_true> *)&local_40,table_name,in_RCX);
  shared_ptr<duckdb::InsertRelation,_true>::shared_ptr(&local_58,&local_30);
  _Var2._M_pi = extraout_RDX;
  if (local_30.super___shared_ptr<duckdb::InsertRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<duckdb::InsertRelation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_00;
  }
  _Var1._M_pi = local_58.internal.
                super___shared_ptr<duckdb::InsertRelation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_58.internal.super___shared_ptr<duckdb::InsertRelation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation =
       (_func_int **)
       local_58.internal.super___shared_ptr<duckdb::InsertRelation,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)_Var1._M_pi;
  local_58.internal.super___shared_ptr<duckdb::InsertRelation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  if (local_40.__weak_this_.internal.super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.__weak_this_.internal.
               super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<duckdb::Relation,_true>)
         sVar3.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<Relation> Relation::InsertRel(const string &schema_name, const string &table_name) {
	return make_shared_ptr<InsertRelation>(shared_from_this(), schema_name, table_name);
}